

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O3

void proto3_arena_unittest::TestAllTypes::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  _func_int **pp_Var6;
  ulong uVar7;
  _func_int *p_Var8;
  void *pvVar9;
  Arena *pAVar10;
  Arena *extraout_RDX;
  Arena *extraout_RDX_00;
  uint unaff_EBP;
  string *psVar11;
  InternalMetadata *pIVar12;
  MessageLite *pMVar13;
  Arena *arena;
  _Alloc_hider local_48;
  undefined8 local_38;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    psVar11 = (string *)to_msg;
    MergeImpl();
    goto LAB_00cf9682;
  }
  google::protobuf::RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)(to_msg + 2),(RepeatedField<int> *)(from_msg + 2));
  google::protobuf::RepeatedField<long>::MergeFrom
            ((RepeatedField<long> *)&to_msg[3]._internal_metadata_,
             (RepeatedField<long> *)&from_msg[3]._internal_metadata_);
  google::protobuf::RepeatedField<unsigned_int>::MergeFrom
            ((RepeatedField<unsigned_int> *)(to_msg + 5),
             (RepeatedField<unsigned_int> *)(from_msg + 5));
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom
            ((RepeatedField<unsigned_long> *)&to_msg[6]._internal_metadata_,
             (RepeatedField<unsigned_long> *)&from_msg[6]._internal_metadata_);
  google::protobuf::RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)(to_msg + 8),(RepeatedField<int> *)(from_msg + 8));
  google::protobuf::RepeatedField<long>::MergeFrom
            ((RepeatedField<long> *)&to_msg[9]._internal_metadata_,
             (RepeatedField<long> *)&from_msg[9]._internal_metadata_);
  google::protobuf::RepeatedField<unsigned_int>::MergeFrom
            ((RepeatedField<unsigned_int> *)(to_msg + 0xb),
             (RepeatedField<unsigned_int> *)(from_msg + 0xb));
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom
            ((RepeatedField<unsigned_long> *)(to_msg + 0xc),
             (RepeatedField<unsigned_long> *)(from_msg + 0xc));
  google::protobuf::RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)(to_msg + 0xd),(RepeatedField<int> *)(from_msg + 0xd));
  google::protobuf::RepeatedField<long>::MergeFrom
            ((RepeatedField<long> *)(to_msg + 0xe),(RepeatedField<long> *)(from_msg + 0xe));
  google::protobuf::RepeatedField<float>::MergeFrom
            ((RepeatedField<float> *)(to_msg + 0xf),(RepeatedField<float> *)(from_msg + 0xf));
  google::protobuf::RepeatedField<double>::MergeFrom
            ((RepeatedField<double> *)(to_msg + 0x10),(RepeatedField<double> *)(from_msg + 0x10));
  google::protobuf::RepeatedField<bool>::MergeFrom
            ((RepeatedField<bool> *)(to_msg + 0x11),(RepeatedField<bool> *)(from_msg + 0x11));
  if ((int)from_msg[0x12]._internal_metadata_.ptr_ != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
              ((RepeatedPtrFieldBase *)(to_msg + 0x12),(RepeatedPtrFieldBase *)(from_msg + 0x12));
  }
  if (*(int *)&from_msg[0x14]._vptr_MessageLite != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
              ((RepeatedPtrFieldBase *)&to_msg[0x13]._internal_metadata_,
               (RepeatedPtrFieldBase *)&from_msg[0x13]._internal_metadata_);
  }
  if ((int)from_msg[0x15]._internal_metadata_.ptr_ != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
              ((RepeatedPtrFieldBase *)(to_msg + 0x15),(RepeatedPtrFieldBase *)(from_msg + 0x15),
               google::protobuf::Arena::
               CopyConstruct<proto3_arena_unittest::TestAllTypes_NestedMessage>);
  }
  if (*(int *)&from_msg[0x17]._vptr_MessageLite != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
              ((RepeatedPtrFieldBase *)&to_msg[0x16]._internal_metadata_,
               (RepeatedPtrFieldBase *)&from_msg[0x16]._internal_metadata_,
               google::protobuf::Arena::CopyConstruct<proto3_arena_unittest::ForeignMessage>);
  }
  if ((int)from_msg[0x18]._internal_metadata_.ptr_ != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
              ((RepeatedPtrFieldBase *)(to_msg + 0x18),(RepeatedPtrFieldBase *)(from_msg + 0x18),
               google::protobuf::Arena::CopyConstruct<proto2_unittest_import::ImportMessage>);
  }
  google::protobuf::RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)&to_msg[0x19]._internal_metadata_,
             (RepeatedField<int> *)&from_msg[0x19]._internal_metadata_);
  google::protobuf::RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)(to_msg + 0x1b),(RepeatedField<int> *)(from_msg + 0x1b));
  if (*(int *)&from_msg[0x1d]._vptr_MessageLite != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
              ((RepeatedPtrFieldBase *)&to_msg[0x1c]._internal_metadata_,
               (RepeatedPtrFieldBase *)&from_msg[0x1c]._internal_metadata_);
  }
  if ((int)from_msg[0x1e]._internal_metadata_.ptr_ != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
              ((RepeatedPtrFieldBase *)(to_msg + 0x1e),(RepeatedPtrFieldBase *)(from_msg + 0x1e));
  }
  if (*(int *)&from_msg[0x20]._vptr_MessageLite != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
              ((RepeatedPtrFieldBase *)&to_msg[0x1f]._internal_metadata_,
               (RepeatedPtrFieldBase *)&from_msg[0x1f]._internal_metadata_,
               google::protobuf::Arena::
               CopyConstruct<proto3_arena_unittest::TestAllTypes_NestedMessage>);
  }
  unaff_EBP = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((char)unaff_EBP == '\0') goto LAB_00cf9148;
  if ((unaff_EBP & 1) == 0) goto LAB_00cf8ea7;
  psVar11 = (string *)((ulong)from_msg[0x21]._vptr_MessageLite & 0xfffffffffffffffc);
  if (((InternalMetadata *)&psVar11->_M_string_length)->ptr_ == 0) {
    if (((ulong)to_msg[0x21]._vptr_MessageLite & 3) != 0) goto LAB_00cf8ea7;
    local_48._M_p = (pointer)&stack0xffffffffffffffc8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffffb8,anon_var_dwarf_a22956 + 5);
    *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 1;
    pAVar10 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar10 & 1) != 0) {
      pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
    }
    google::protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)(to_msg + 0x21),(string *)&stack0xffffffffffffffb8,pAVar10);
    if (local_48._M_p == (pointer)&stack0xffffffffffffffc8) goto LAB_00cf8ea7;
    operator_delete(local_48._M_p,local_38 + 1);
    goto LAB_00cf8ea7;
  }
  *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 1;
  pMVar13 = to_msg + 0x21;
  pAVar10 = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)pAVar10 & 1) != 0) goto LAB_00cf96d2;
  do {
    google::protobuf::internal::ArenaStringPtr::Set<>((ArenaStringPtr *)pMVar13,psVar11,pAVar10);
LAB_00cf8ea7:
    if ((unaff_EBP & 2) != 0) {
      psVar11 = (string *)(from_msg[0x21]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
      if (psVar11->_M_string_length == 0) {
        if ((to_msg[0x21]._internal_metadata_.ptr_ & 3) == 0) {
          local_48._M_p = (pointer)&stack0xffffffffffffffc8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xffffffffffffffb8,anon_var_dwarf_a22956 + 5);
          *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 2;
          pAVar10 = (Arena *)(to_msg->_internal_metadata_).ptr_;
          if (((ulong)pAVar10 & 1) != 0) {
            pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
          }
          google::protobuf::internal::ArenaStringPtr::Set<>
                    ((ArenaStringPtr *)&to_msg[0x21]._internal_metadata_,
                     (string *)&stack0xffffffffffffffb8,pAVar10);
          if (local_48._M_p != (pointer)&stack0xffffffffffffffc8) {
            operator_delete(local_48._M_p,local_38 + 1);
          }
        }
      }
      else {
        *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 2;
        pAVar10 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar10 & 1) != 0) {
          pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)&to_msg[0x21]._internal_metadata_,psVar11,pAVar10);
      }
    }
    if ((unaff_EBP & 4) != 0) {
      psVar11 = (string *)((ulong)from_msg[0x22]._vptr_MessageLite & 0xfffffffffffffffc);
      if (psVar11->_M_string_length == 0) {
        if (((ulong)to_msg[0x22]._vptr_MessageLite & 3) == 0) {
          local_48._M_p = (pointer)&stack0xffffffffffffffc8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xffffffffffffffb8,anon_var_dwarf_a22956 + 5);
          *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 4;
          pAVar10 = (Arena *)(to_msg->_internal_metadata_).ptr_;
          if (((ulong)pAVar10 & 1) != 0) {
            pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
          }
          google::protobuf::internal::ArenaStringPtr::Set<>
                    ((ArenaStringPtr *)(to_msg + 0x22),(string *)&stack0xffffffffffffffb8,pAVar10);
          if (local_48._M_p != (pointer)&stack0xffffffffffffffc8) {
            operator_delete(local_48._M_p,local_38 + 1);
          }
        }
      }
      else {
        *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 4;
        pAVar10 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar10 & 1) != 0) {
          pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)(to_msg + 0x22),psVar11,pAVar10);
      }
    }
    if ((unaff_EBP & 8) != 0) {
      psVar11 = (string *)(from_msg[0x22]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
      if (psVar11->_M_string_length == 0) {
        if ((to_msg[0x22]._internal_metadata_.ptr_ & 3) == 0) {
          local_48._M_p = (pointer)&stack0xffffffffffffffc8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xffffffffffffffb8,anon_var_dwarf_a22956 + 5);
          *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 8;
          pAVar10 = (Arena *)(to_msg->_internal_metadata_).ptr_;
          if (((ulong)pAVar10 & 1) != 0) {
            pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
          }
          google::protobuf::internal::ArenaStringPtr::Set<>
                    ((ArenaStringPtr *)&to_msg[0x22]._internal_metadata_,
                     (string *)&stack0xffffffffffffffb8,pAVar10);
          if (local_48._M_p != (pointer)&stack0xffffffffffffffc8) {
            operator_delete(local_48._M_p,local_38 + 1);
          }
        }
      }
      else {
        *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 8;
        pAVar10 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar10 & 1) != 0) {
          pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)&to_msg[0x22]._internal_metadata_,psVar11,pAVar10);
      }
    }
    if ((unaff_EBP & 0x10) == 0) {
LAB_00cf90a1:
      if ((unaff_EBP & 0x20) != 0) {
        psVar11 = (string *)from_msg[0x23]._internal_metadata_.ptr_;
        if (psVar11 == (string *)0x0) goto LAB_00cf968a;
        pMVar13 = (MessageLite *)to_msg[0x23]._internal_metadata_.ptr_;
        if (pMVar13 == (MessageLite *)0x0) {
          pvVar9 = google::protobuf::Arena::CopyConstruct<proto3_arena_unittest::ForeignMessage>
                             (arena,psVar11);
          to_msg[0x23]._internal_metadata_.ptr_ = (intptr_t)pvVar9;
        }
        else {
          ForeignMessage::MergeImpl(pMVar13,(MessageLite *)psVar11);
        }
      }
      if ((unaff_EBP & 0x40) != 0) {
        psVar11 = (string *)from_msg[0x24]._vptr_MessageLite;
        if (psVar11 == (string *)0x0) goto LAB_00cf9692;
        if ((MessageLite *)to_msg[0x24]._vptr_MessageLite == (MessageLite *)0x0) {
          pp_Var6 = (_func_int **)
                    google::protobuf::Arena::CopyConstruct<proto2_unittest_import::ImportMessage>
                              (arena,psVar11);
          to_msg[0x24]._vptr_MessageLite = pp_Var6;
        }
        else {
          proto2_unittest_import::ImportMessage::MergeImpl
                    ((MessageLite *)to_msg[0x24]._vptr_MessageLite,(MessageLite *)psVar11);
        }
      }
      if ((char)unaff_EBP < '\0') {
        psVar11 = (string *)from_msg[0x24]._internal_metadata_.ptr_;
        if (psVar11 != (string *)0x0) {
          pMVar13 = (MessageLite *)to_msg[0x24]._internal_metadata_.ptr_;
          if (pMVar13 == (MessageLite *)0x0) {
            pvVar9 = google::protobuf::Arena::
                     CopyConstruct<proto2_unittest_import::PublicImportMessage>(arena,psVar11);
            to_msg[0x24]._internal_metadata_.ptr_ = (intptr_t)pvVar9;
          }
          else {
            proto2_unittest_import::PublicImportMessage::MergeImpl(pMVar13,(MessageLite *)psVar11);
          }
          goto LAB_00cf9148;
        }
        goto LAB_00cf96a2;
      }
LAB_00cf9148:
      if ((unaff_EBP & 0xff00) != 0) {
        if ((unaff_EBP >> 8 & 1) != 0) {
          psVar11 = (string *)from_msg[0x25]._vptr_MessageLite;
          if (psVar11 == (string *)0x0) goto LAB_00cf969a;
          if ((MessageLite *)to_msg[0x25]._vptr_MessageLite == (MessageLite *)0x0) {
            pp_Var6 = (_func_int **)
                      google::protobuf::Arena::
                      CopyConstruct<proto3_arena_unittest::TestAllTypes_NestedMessage>
                                (arena,psVar11);
            to_msg[0x25]._vptr_MessageLite = pp_Var6;
          }
          else {
            TestAllTypes_NestedMessage::MergeImpl
                      ((MessageLite *)to_msg[0x25]._vptr_MessageLite,(MessageLite *)psVar11);
          }
        }
        if ((unaff_EBP >> 9 & 1) == 0) {
LAB_00cf91c4:
          if (((unaff_EBP >> 10 & 1) != 0) &&
             (from_msg[0x26]._vptr_MessageLite != (_func_int **)0x0)) {
            to_msg[0x26]._vptr_MessageLite = from_msg[0x26]._vptr_MessageLite;
          }
          if (((unaff_EBP >> 0xb & 1) != 0) &&
             (iVar2 = (int)from_msg[0x26]._internal_metadata_.ptr_, iVar2 != 0)) {
            *(int *)&to_msg[0x26]._internal_metadata_.ptr_ = iVar2;
          }
          if (((unaff_EBP >> 0xc & 1) != 0) &&
             (iVar2 = *(int *)((long)&from_msg[0x26]._internal_metadata_.ptr_ + 4), iVar2 != 0)) {
            *(int *)((long)&to_msg[0x26]._internal_metadata_.ptr_ + 4) = iVar2;
          }
          if (((unaff_EBP >> 0xd & 1) != 0) &&
             (from_msg[0x27]._vptr_MessageLite != (_func_int **)0x0)) {
            to_msg[0x27]._vptr_MessageLite = from_msg[0x27]._vptr_MessageLite;
          }
          if (((unaff_EBP >> 0xe & 1) != 0) &&
             (lVar5 = from_msg[0x27]._internal_metadata_.ptr_, lVar5 != 0)) {
            to_msg[0x27]._internal_metadata_.ptr_ = lVar5;
          }
          if (((short)unaff_EBP < 0) && (*(int *)&from_msg[0x28]._vptr_MessageLite != 0)) {
            *(int *)&to_msg[0x28]._vptr_MessageLite = *(int *)&from_msg[0x28]._vptr_MessageLite;
          }
          goto LAB_00cf9253;
        }
        psVar11 = (string *)from_msg[0x25]._internal_metadata_.ptr_;
        if (psVar11 != (string *)0x0) {
          pMVar13 = (MessageLite *)to_msg[0x25]._internal_metadata_.ptr_;
          if (pMVar13 == (MessageLite *)0x0) {
            pvVar9 = google::protobuf::Arena::
                     CopyConstruct<proto3_arena_unittest::TestAllTypes_NestedMessage>(arena,psVar11)
            ;
            to_msg[0x25]._internal_metadata_.ptr_ = (intptr_t)pvVar9;
          }
          else {
            TestAllTypes_NestedMessage::MergeImpl(pMVar13,(MessageLite *)psVar11);
          }
          goto LAB_00cf91c4;
        }
        goto LAB_00cf96aa;
      }
LAB_00cf9253:
      if ((unaff_EBP & 0xff0000) != 0) {
        if (((unaff_EBP >> 0x10 & 1) != 0) &&
           (iVar2 = *(int *)((long)&from_msg[0x28]._vptr_MessageLite + 4), iVar2 != 0)) {
          *(int *)((long)&to_msg[0x28]._vptr_MessageLite + 4) = iVar2;
        }
        if (((unaff_EBP >> 0x11 & 1) != 0) &&
           (lVar5 = from_msg[0x28]._internal_metadata_.ptr_, lVar5 != 0)) {
          to_msg[0x28]._internal_metadata_.ptr_ = lVar5;
        }
        if (((unaff_EBP >> 0x12 & 1) != 0) &&
           (from_msg[0x29]._vptr_MessageLite != (_func_int **)0x0)) {
          to_msg[0x29]._vptr_MessageLite = from_msg[0x29]._vptr_MessageLite;
        }
        if (((unaff_EBP >> 0x13 & 1) != 0) &&
           (iVar2 = (int)from_msg[0x29]._internal_metadata_.ptr_, iVar2 != 0)) {
          *(int *)&to_msg[0x29]._internal_metadata_.ptr_ = iVar2;
        }
        if (((unaff_EBP >> 0x14 & 1) != 0) &&
           (iVar2 = *(int *)((long)&from_msg[0x29]._internal_metadata_.ptr_ + 4), iVar2 != 0)) {
          *(int *)((long)&to_msg[0x29]._internal_metadata_.ptr_ + 4) = iVar2;
        }
        if (((unaff_EBP >> 0x15 & 1) != 0) &&
           (from_msg[0x2a]._vptr_MessageLite != (_func_int **)0x0)) {
          to_msg[0x2a]._vptr_MessageLite = from_msg[0x2a]._vptr_MessageLite;
        }
        if (((unaff_EBP >> 0x16 & 1) != 0) &&
           ((char)from_msg[0x2a]._internal_metadata_.ptr_ == '\x01')) {
          *(undefined1 *)&to_msg[0x2a]._internal_metadata_.ptr_ = 1;
        }
        if (((unaff_EBP >> 0x17 & 1) != 0) &&
           (iVar2 = *(int *)((long)&from_msg[0x2a]._internal_metadata_.ptr_ + 4), iVar2 != 0)) {
          *(int *)((long)&to_msg[0x2a]._internal_metadata_.ptr_ + 4) = iVar2;
        }
      }
      if (unaff_EBP < 0x1000000) goto LAB_00cf947b;
      if (((unaff_EBP >> 0x18 & 1) != 0) && (*(int *)&from_msg[0x2b]._vptr_MessageLite != 0)) {
        *(int *)&to_msg[0x2b]._vptr_MessageLite = *(int *)&from_msg[0x2b]._vptr_MessageLite;
      }
      if ((unaff_EBP >> 0x19 & 1) != 0) {
        *(undefined4 *)((long)&to_msg[0x2b]._vptr_MessageLite + 4) =
             *(undefined4 *)((long)&from_msg[0x2b]._vptr_MessageLite + 4);
      }
      if ((unaff_EBP >> 0x1a & 1) != 0) {
        uVar7 = (ulong)(char)from_msg[0x2b]._internal_metadata_.ptr_;
        if ((uVar7 & 1) == 0) {
          p_Var8 = (_func_int *)(uVar7 >> 1);
        }
        else {
          p_Var8 = *from_msg[0x2c]._vptr_MessageLite;
        }
        if (p_Var8 != (_func_int *)0x0) {
          pbVar1 = (byte *)((long)&to_msg[1]._vptr_MessageLite + 3);
          *pbVar1 = *pbVar1 | 4;
          pIVar12 = &from_msg[0x2b]._internal_metadata_;
          if (((to_msg[0x2b]._internal_metadata_.ptr_ & 1) == 0) && ((pIVar12->ptr_ & 1) == 0)) {
            pp_Var6 = from_msg[0x2c]._vptr_MessageLite;
            to_msg[0x2b]._internal_metadata_.ptr_ = pIVar12->ptr_;
            to_msg[0x2c]._vptr_MessageLite = pp_Var6;
          }
          else {
            absl::lts_20250127::Cord::InlineRep::AssignSlow
                      ((InlineRep *)&to_msg[0x2b]._internal_metadata_,(InlineRep *)pIVar12);
          }
        }
      }
      if ((unaff_EBP >> 0x1b & 1) != 0) {
        uVar7 = from_msg[0x2c]._internal_metadata_.ptr_;
        *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 0x8000000;
        psVar11 = (string *)(uVar7 & 0xfffffffffffffffc);
        pIVar12 = &to_msg[0x2c]._internal_metadata_;
        pAVar10 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar10 & 1) != 0) goto LAB_00cf96b2;
        goto LAB_00cf93e8;
      }
    }
    else {
      psVar11 = (string *)from_msg[0x23]._vptr_MessageLite;
      if (psVar11 != (string *)0x0) {
        if ((MessageLite *)to_msg[0x23]._vptr_MessageLite == (MessageLite *)0x0) {
          pp_Var6 = (_func_int **)
                    google::protobuf::Arena::
                    CopyConstruct<proto3_arena_unittest::TestAllTypes_NestedMessage>(arena,psVar11);
          to_msg[0x23]._vptr_MessageLite = pp_Var6;
        }
        else {
          TestAllTypes_NestedMessage::MergeImpl
                    ((MessageLite *)to_msg[0x23]._vptr_MessageLite,(MessageLite *)psVar11);
        }
        goto LAB_00cf90a1;
      }
LAB_00cf9682:
      MergeImpl((TestAllTypes *)&stack0xffffffffffffffb8);
LAB_00cf968a:
      MergeImpl((TestAllTypes *)&stack0xffffffffffffffb8);
LAB_00cf9692:
      MergeImpl((TestAllTypes *)&stack0xffffffffffffffb8);
LAB_00cf969a:
      MergeImpl((TestAllTypes *)&stack0xffffffffffffffb8);
LAB_00cf96a2:
      MergeImpl((TestAllTypes *)&stack0xffffffffffffffb8);
LAB_00cf96aa:
      pIVar12 = (InternalMetadata *)&stack0xffffffffffffffb8;
      MergeImpl((TestAllTypes *)&stack0xffffffffffffffb8);
      pAVar10 = extraout_RDX;
LAB_00cf96b2:
      pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
LAB_00cf93e8:
      google::protobuf::internal::ArenaStringPtr::Set<>((ArenaStringPtr *)pIVar12,psVar11,pAVar10);
    }
    if ((unaff_EBP >> 0x1c & 1) != 0) {
      pp_Var6 = from_msg[0x2d]._vptr_MessageLite;
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 0x10000000;
      pAVar10 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar10 & 1) != 0) {
        pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)(to_msg + 0x2d),(string *)((ulong)pp_Var6 & 0xfffffffffffffffc),
                 pAVar10);
    }
    if ((unaff_EBP >> 0x1d & 1) == 0) goto LAB_00cf9456;
    psVar11 = (string *)from_msg[0x2d]._internal_metadata_.ptr_;
    if (psVar11 != (string *)0x0) break;
    pMVar13 = (MessageLite *)&stack0xffffffffffffffb8;
    MergeImpl((TestAllTypes *)&stack0xffffffffffffffb8);
    pAVar10 = extraout_RDX_00;
LAB_00cf96d2:
    pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
  } while( true );
  pMVar13 = (MessageLite *)to_msg[0x2d]._internal_metadata_.ptr_;
  if (pMVar13 == (MessageLite *)0x0) {
    pvVar9 = google::protobuf::Arena::CopyConstruct<proto2_unittest_import::ImportMessage>
                       (arena,psVar11);
    to_msg[0x2d]._internal_metadata_.ptr_ = (intptr_t)pvVar9;
  }
  else {
    proto2_unittest_import::ImportMessage::MergeImpl(pMVar13,(MessageLite *)psVar11);
  }
LAB_00cf9456:
  if ((unaff_EBP >> 0x1e & 1) != 0) {
    to_msg[0x2e]._vptr_MessageLite = from_msg[0x2e]._vptr_MessageLite;
  }
  if ((int)unaff_EBP < 0) {
    *(int *)&to_msg[0x2e]._internal_metadata_.ptr_ = (int)from_msg[0x2e]._internal_metadata_.ptr_;
  }
LAB_00cf947b:
  uVar3 = *(uint *)((long)&from_msg[1]._vptr_MessageLite + 4);
  if ((char)uVar3 != '\0') {
    if ((uVar3 & 1) != 0) {
      *(undefined4 *)((long)&to_msg[0x2e]._internal_metadata_.ptr_ + 4) =
           *(undefined4 *)((long)&from_msg[0x2e]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar3 & 2) != 0) {
      to_msg[0x2f]._vptr_MessageLite = from_msg[0x2f]._vptr_MessageLite;
    }
    if ((uVar3 & 4) != 0) {
      to_msg[0x2f]._internal_metadata_.ptr_ = from_msg[0x2f]._internal_metadata_.ptr_;
    }
    if ((uVar3 & 8) != 0) {
      *(undefined4 *)&to_msg[0x30]._vptr_MessageLite =
           *(undefined4 *)&from_msg[0x30]._vptr_MessageLite;
    }
    if ((uVar3 & 0x10) != 0) {
      *(undefined4 *)((long)&to_msg[0x30]._vptr_MessageLite + 4) =
           *(undefined4 *)((long)&from_msg[0x30]._vptr_MessageLite + 4);
    }
    if ((uVar3 & 0x20) != 0) {
      to_msg[0x30]._internal_metadata_.ptr_ = from_msg[0x30]._internal_metadata_.ptr_;
    }
    if ((uVar3 & 0x40) != 0) {
      to_msg[0x31]._vptr_MessageLite = from_msg[0x31]._vptr_MessageLite;
    }
    if ((char)uVar3 < '\0') {
      *(int *)&to_msg[0x31]._internal_metadata_.ptr_ = (int)from_msg[0x31]._internal_metadata_.ptr_;
    }
  }
  if ((uVar3 & 0x300) != 0) {
    if ((uVar3 >> 8 & 1) != 0) {
      *(undefined1 *)((long)&to_msg[0x31]._internal_metadata_.ptr_ + 4) =
           *(undefined1 *)((long)&from_msg[0x31]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar3 >> 9 & 1) != 0) {
      to_msg[0x32]._vptr_MessageLite = from_msg[0x32]._vptr_MessageLite;
    }
  }
  to_msg[1]._vptr_MessageLite =
       (_func_int **)((ulong)to_msg[1]._vptr_MessageLite | (ulong)from_msg[1]._vptr_MessageLite);
  iVar2 = *(int *)&from_msg[0x33]._vptr_MessageLite;
  if (iVar2 == 0) goto switchD_00cf9596_default;
  iVar4 = *(int *)&to_msg[0x33]._vptr_MessageLite;
  if (iVar4 != iVar2) {
    if (iVar4 != 0) {
      clear_oneof_field((TestAllTypes *)to_msg);
    }
    *(int *)&to_msg[0x33]._vptr_MessageLite = iVar2;
  }
  switch(iVar2) {
  case 0x6f:
    *(int *)&to_msg[0x32]._internal_metadata_.ptr_ = (int)from_msg[0x32]._internal_metadata_.ptr_;
    break;
  case 0x70:
    if (iVar4 == iVar2) {
      TestAllTypes_NestedMessage::MergeImpl
                ((MessageLite *)to_msg[0x32]._internal_metadata_.ptr_,
                 (MessageLite *)from_msg[0x32]._internal_metadata_.ptr_);
    }
    else {
      pvVar9 = google::protobuf::Arena::
               CopyConstruct<proto3_arena_unittest::TestAllTypes_NestedMessage>
                         (arena,(void *)from_msg[0x32]._internal_metadata_.ptr_);
      to_msg[0x32]._internal_metadata_.ptr_ = (intptr_t)pvVar9;
    }
    break;
  case 0x71:
    if (iVar4 != iVar2) {
      to_msg[0x32]._internal_metadata_.ptr_ =
           (intptr_t)&google::protobuf::internal::fixed_address_empty_string;
    }
    if (*(int *)&from_msg[0x33]._vptr_MessageLite == 0x71) goto LAB_00cf95f8;
LAB_00cf95cb:
    psVar11 = (string *)&google::protobuf::internal::fixed_address_empty_string;
    goto LAB_00cf9603;
  case 0x72:
    if (iVar4 != iVar2) {
      to_msg[0x32]._internal_metadata_.ptr_ =
           (intptr_t)&google::protobuf::internal::fixed_address_empty_string;
    }
    if (*(int *)&from_msg[0x33]._vptr_MessageLite != 0x72) goto LAB_00cf95cb;
LAB_00cf95f8:
    psVar11 = (string *)(from_msg[0x32]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
LAB_00cf9603:
    google::protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)&to_msg[0x32]._internal_metadata_,psVar11,arena);
  }
switchD_00cf9596_default:
  uVar7 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar7 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar7 & 0xfffffffffffffffe) + 8));
  }
  return;
}

Assistant:

void TestAllTypes::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestAllTypes*>(&to_msg);
  auto& from = static_cast<const TestAllTypes&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto3_arena_unittest.TestAllTypes)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_int32()->MergeFrom(from._internal_repeated_int32());
  _this->_internal_mutable_repeated_int64()->MergeFrom(from._internal_repeated_int64());
  _this->_internal_mutable_repeated_uint32()->MergeFrom(from._internal_repeated_uint32());
  _this->_internal_mutable_repeated_uint64()->MergeFrom(from._internal_repeated_uint64());
  _this->_internal_mutable_repeated_sint32()->MergeFrom(from._internal_repeated_sint32());
  _this->_internal_mutable_repeated_sint64()->MergeFrom(from._internal_repeated_sint64());
  _this->_internal_mutable_repeated_fixed32()->MergeFrom(from._internal_repeated_fixed32());
  _this->_internal_mutable_repeated_fixed64()->MergeFrom(from._internal_repeated_fixed64());
  _this->_internal_mutable_repeated_sfixed32()->MergeFrom(from._internal_repeated_sfixed32());
  _this->_internal_mutable_repeated_sfixed64()->MergeFrom(from._internal_repeated_sfixed64());
  _this->_internal_mutable_repeated_float()->MergeFrom(from._internal_repeated_float());
  _this->_internal_mutable_repeated_double()->MergeFrom(from._internal_repeated_double());
  _this->_internal_mutable_repeated_bool()->MergeFrom(from._internal_repeated_bool());
  _this->_internal_mutable_repeated_string()->MergeFrom(from._internal_repeated_string());
  _this->_internal_mutable_repeated_bytes()->MergeFrom(from._internal_repeated_bytes());
  _this->_internal_mutable_repeated_nested_message()->MergeFrom(
      from._internal_repeated_nested_message());
  _this->_internal_mutable_repeated_foreign_message()->MergeFrom(
      from._internal_repeated_foreign_message());
  _this->_internal_mutable_repeated_import_message()->MergeFrom(
      from._internal_repeated_import_message());
  _this->_internal_mutable_repeated_nested_enum()->MergeFrom(from._internal_repeated_nested_enum());
  _this->_internal_mutable_repeated_foreign_enum()->MergeFrom(from._internal_repeated_foreign_enum());
  _this->_internal_mutable_repeated_string_piece()->MergeFrom(from._internal_repeated_string_piece());
  _this->_internal_mutable_repeated_cord()->MergeFrom(from._internal_repeated_cord());
  _this->_internal_mutable_repeated_lazy_message()->MergeFrom(
      from._internal_repeated_lazy_message());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!from._internal_optional_string().empty()) {
        _this->_internal_set_optional_string(from._internal_optional_string());
      } else {
        if (_this->_impl_.optional_string_.IsDefault()) {
          _this->_internal_set_optional_string("");
        }
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (!from._internal_optional_bytes().empty()) {
        _this->_internal_set_optional_bytes(from._internal_optional_bytes());
      } else {
        if (_this->_impl_.optional_bytes_.IsDefault()) {
          _this->_internal_set_optional_bytes("");
        }
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (!from._internal_optional_string_piece().empty()) {
        _this->_internal_set_optional_string_piece(from._internal_optional_string_piece());
      } else {
        if (_this->_impl_.optional_string_piece_.IsDefault()) {
          _this->_internal_set_optional_string_piece("");
        }
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (!from._internal_optional_cord().empty()) {
        _this->_internal_set_optional_cord(from._internal_optional_cord());
      } else {
        if (_this->_impl_.optional_cord_.IsDefault()) {
          _this->_internal_set_optional_cord("");
        }
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(from._impl_.optional_nested_message_ != nullptr);
      if (_this->_impl_.optional_nested_message_ == nullptr) {
        _this->_impl_.optional_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_nested_message_);
      } else {
        _this->_impl_.optional_nested_message_->MergeFrom(*from._impl_.optional_nested_message_);
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      ABSL_DCHECK(from._impl_.optional_foreign_message_ != nullptr);
      if (_this->_impl_.optional_foreign_message_ == nullptr) {
        _this->_impl_.optional_foreign_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_foreign_message_);
      } else {
        _this->_impl_.optional_foreign_message_->MergeFrom(*from._impl_.optional_foreign_message_);
      }
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      ABSL_DCHECK(from._impl_.optional_import_message_ != nullptr);
      if (_this->_impl_.optional_import_message_ == nullptr) {
        _this->_impl_.optional_import_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_import_message_);
      } else {
        _this->_impl_.optional_import_message_->MergeFrom(*from._impl_.optional_import_message_);
      }
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      ABSL_DCHECK(from._impl_.optional_public_import_message_ != nullptr);
      if (_this->_impl_.optional_public_import_message_ == nullptr) {
        _this->_impl_.optional_public_import_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_public_import_message_);
      } else {
        _this->_impl_.optional_public_import_message_->MergeFrom(*from._impl_.optional_public_import_message_);
      }
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      ABSL_DCHECK(from._impl_.optional_lazy_message_ != nullptr);
      if (_this->_impl_.optional_lazy_message_ == nullptr) {
        _this->_impl_.optional_lazy_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_lazy_message_);
      } else {
        _this->_impl_.optional_lazy_message_->MergeFrom(*from._impl_.optional_lazy_message_);
      }
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      ABSL_DCHECK(from._impl_.optional_unverified_lazy_message_ != nullptr);
      if (_this->_impl_.optional_unverified_lazy_message_ == nullptr) {
        _this->_impl_.optional_unverified_lazy_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_unverified_lazy_message_);
      } else {
        _this->_impl_.optional_unverified_lazy_message_->MergeFrom(*from._impl_.optional_unverified_lazy_message_);
      }
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      if (from._internal_optional_int64() != 0) {
        _this->_impl_.optional_int64_ = from._impl_.optional_int64_;
      }
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      if (from._internal_optional_int32() != 0) {
        _this->_impl_.optional_int32_ = from._impl_.optional_int32_;
      }
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      if (from._internal_optional_uint32() != 0) {
        _this->_impl_.optional_uint32_ = from._impl_.optional_uint32_;
      }
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      if (from._internal_optional_uint64() != 0) {
        _this->_impl_.optional_uint64_ = from._impl_.optional_uint64_;
      }
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      if (from._internal_optional_sint64() != 0) {
        _this->_impl_.optional_sint64_ = from._impl_.optional_sint64_;
      }
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      if (from._internal_optional_sint32() != 0) {
        _this->_impl_.optional_sint32_ = from._impl_.optional_sint32_;
      }
    }
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    if ((cached_has_bits & 0x00010000u) != 0) {
      if (from._internal_optional_fixed32() != 0) {
        _this->_impl_.optional_fixed32_ = from._impl_.optional_fixed32_;
      }
    }
    if ((cached_has_bits & 0x00020000u) != 0) {
      if (from._internal_optional_fixed64() != 0) {
        _this->_impl_.optional_fixed64_ = from._impl_.optional_fixed64_;
      }
    }
    if ((cached_has_bits & 0x00040000u) != 0) {
      if (from._internal_optional_sfixed64() != 0) {
        _this->_impl_.optional_sfixed64_ = from._impl_.optional_sfixed64_;
      }
    }
    if ((cached_has_bits & 0x00080000u) != 0) {
      if (from._internal_optional_sfixed32() != 0) {
        _this->_impl_.optional_sfixed32_ = from._impl_.optional_sfixed32_;
      }
    }
    if ((cached_has_bits & 0x00100000u) != 0) {
      if (::absl::bit_cast<::uint32_t>(from._internal_optional_float()) != 0) {
        _this->_impl_.optional_float_ = from._impl_.optional_float_;
      }
    }
    if ((cached_has_bits & 0x00200000u) != 0) {
      if (::absl::bit_cast<::uint64_t>(from._internal_optional_double()) != 0) {
        _this->_impl_.optional_double_ = from._impl_.optional_double_;
      }
    }
    if ((cached_has_bits & 0x00400000u) != 0) {
      if (from._internal_optional_bool() != 0) {
        _this->_impl_.optional_bool_ = from._impl_.optional_bool_;
      }
    }
    if ((cached_has_bits & 0x00800000u) != 0) {
      if (from._internal_optional_nested_enum() != 0) {
        _this->_impl_.optional_nested_enum_ = from._impl_.optional_nested_enum_;
      }
    }
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    if ((cached_has_bits & 0x01000000u) != 0) {
      if (from._internal_optional_foreign_enum() != 0) {
        _this->_impl_.optional_foreign_enum_ = from._impl_.optional_foreign_enum_;
      }
    }
    if ((cached_has_bits & 0x02000000u) != 0) {
      _this->_impl_.proto3_optional_float_ = from._impl_.proto3_optional_float_;
    }
    if ((cached_has_bits & 0x04000000u) != 0) {
      if (!from._internal_optional_bytes_cord().empty()) {
        _this->_internal_set_optional_bytes_cord(from._internal_optional_bytes_cord());
      }
    }
    if ((cached_has_bits & 0x08000000u) != 0) {
      _this->_internal_set_proto3_optional_string(from._internal_proto3_optional_string());
    }
    if ((cached_has_bits & 0x10000000u) != 0) {
      _this->_internal_set_proto3_optional_bytes(from._internal_proto3_optional_bytes());
    }
    if ((cached_has_bits & 0x20000000u) != 0) {
      ABSL_DCHECK(from._impl_.optional_lazy_import_message_ != nullptr);
      if (_this->_impl_.optional_lazy_import_message_ == nullptr) {
        _this->_impl_.optional_lazy_import_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_lazy_import_message_);
      } else {
        _this->_impl_.optional_lazy_import_message_->MergeFrom(*from._impl_.optional_lazy_import_message_);
      }
    }
    if ((cached_has_bits & 0x40000000u) != 0) {
      _this->_impl_.proto3_optional_int64_ = from._impl_.proto3_optional_int64_;
    }
    if ((cached_has_bits & 0x80000000u) != 0) {
      _this->_impl_.proto3_optional_int32_ = from._impl_.proto3_optional_int32_;
    }
  }
  cached_has_bits = from._impl_._has_bits_[1];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.proto3_optional_uint32_ = from._impl_.proto3_optional_uint32_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.proto3_optional_uint64_ = from._impl_.proto3_optional_uint64_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.proto3_optional_sint64_ = from._impl_.proto3_optional_sint64_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.proto3_optional_sint32_ = from._impl_.proto3_optional_sint32_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.proto3_optional_fixed32_ = from._impl_.proto3_optional_fixed32_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.proto3_optional_fixed64_ = from._impl_.proto3_optional_fixed64_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.proto3_optional_sfixed64_ = from._impl_.proto3_optional_sfixed64_;
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_impl_.proto3_optional_sfixed32_ = from._impl_.proto3_optional_sfixed32_;
    }
  }
  if ((cached_has_bits & 0x00000300u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _this->_impl_.proto3_optional_bool_ = from._impl_.proto3_optional_bool_;
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      _this->_impl_.proto3_optional_double_ = from._impl_.proto3_optional_double_;
    }
  }
  _this->_impl_._has_bits_.Or(from._impl_._has_bits_);
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_oneof_field();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kOneofUint32: {
        _this->_impl_.oneof_field_.oneof_uint32_ = from._impl_.oneof_field_.oneof_uint32_;
        break;
      }
      case kOneofNestedMessage: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.oneof_field_.oneof_nested_message_);
        } else {
          _this->_impl_.oneof_field_.oneof_nested_message_->MergeFrom(*from._impl_.oneof_field_.oneof_nested_message_);
        }
        break;
      }
      case kOneofString: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_string_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_string_.Set(from._internal_oneof_string(), arena);
        break;
      }
      case kOneofBytes: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_bytes_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_bytes_.Set(from._internal_oneof_bytes(), arena);
        break;
      }
      case ONEOF_FIELD_NOT_SET:
        break;
    }
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}